

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe_utils.c
# Opt level: O1

void av1_save_context(MACROBLOCK *x,RD_SEARCH_MACROBLOCK_CONTEXT *ctx,int mi_row,int mi_col,
                     BLOCK_SIZE bsize,int num_planes)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  TXFM_CONTEXT *pTVar4;
  ulong __n;
  RD_SEARCH_MACROBLOCK_CONTEXT *__dest;
  undefined3 in_register_00000081;
  ulong __n_00;
  ENTROPY_CONTEXT *__dest_00;
  long lVar5;
  long lVar6;
  int tx_row;
  
  bVar1 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
          [CONCAT31(in_register_00000081,bsize)];
  __n_00 = (ulong)bVar1;
  bVar2 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
          [CONCAT31(in_register_00000081,bsize)];
  __n = (ulong)bVar2;
  if (0 < num_planes) {
    __dest_00 = ctx->l;
    lVar5 = 0;
    lVar6 = 0;
    __dest = ctx;
    do {
      bVar3 = *(byte *)((long)(x->e_mbd).plane[0].pre + lVar5 * 4 + -0x2c);
      memcpy(__dest,(void *)((long)(mi_col >> (bVar3 & 0x1f)) +
                            *(long *)((long)(x->e_mbd).above_entropy_context + lVar6)),
             (ulong)(bVar1 >> (bVar3 & 0x3f)));
      bVar3 = *(byte *)((long)(x->e_mbd).plane[0].pre + lVar5 * 4 + -0x28);
      memcpy(__dest_00,
             (x->e_mbd).left_entropy_context[0] +
             lVar6 * 4 + (ulong)((mi_row & 0x1fU) >> (bVar3 & 0x1f)),
             (ulong)(bVar2 >> (bVar3 & 0x3f)));
      __dest_00 = __dest_00 + __n;
      __dest = (RD_SEARCH_MACROBLOCK_CONTEXT *)(__dest->a + __n_00);
      lVar6 = lVar6 + 8;
      lVar5 = lVar5 + 0x28c;
    } while ((ulong)(uint)num_planes << 3 != lVar6);
  }
  memcpy(ctx->sa,(x->e_mbd).above_partition_context + mi_col,__n_00);
  memcpy(ctx->sl,(x->e_mbd).left_partition_context + (mi_row & 0x1f),__n);
  memcpy(ctx->ta,(x->e_mbd).above_txfm_context,__n_00);
  memcpy(ctx->tl,(x->e_mbd).left_txfm_context,__n);
  pTVar4 = (x->e_mbd).left_txfm_context;
  ctx->p_ta = (x->e_mbd).above_txfm_context;
  ctx->p_tl = pTVar4;
  return;
}

Assistant:

void av1_save_context(const MACROBLOCK *x, RD_SEARCH_MACROBLOCK_CONTEXT *ctx,
                      int mi_row, int mi_col, BLOCK_SIZE bsize,
                      const int num_planes) {
  const MACROBLOCKD *xd = &x->e_mbd;
  int p;
  int mi_width = mi_size_wide[bsize];
  int mi_height = mi_size_high[bsize];

  // buffer the above/left context information of the block in search.
  for (p = 0; p < num_planes; ++p) {
    int tx_col = mi_col;
    int tx_row = mi_row & MAX_MIB_MASK;
    memcpy(
        ctx->a + mi_width * p,
        xd->above_entropy_context[p] + (tx_col >> xd->plane[p].subsampling_x),
        (sizeof(ENTROPY_CONTEXT) * mi_width) >> xd->plane[p].subsampling_x);
    memcpy(ctx->l + mi_height * p,
           xd->left_entropy_context[p] + (tx_row >> xd->plane[p].subsampling_y),
           (sizeof(ENTROPY_CONTEXT) * mi_height) >> xd->plane[p].subsampling_y);
  }
  memcpy(ctx->sa, xd->above_partition_context + mi_col,
         sizeof(*xd->above_partition_context) * mi_width);
  memcpy(ctx->sl, xd->left_partition_context + (mi_row & MAX_MIB_MASK),
         sizeof(xd->left_partition_context[0]) * mi_height);
  memcpy(ctx->ta, xd->above_txfm_context,
         sizeof(*xd->above_txfm_context) * mi_width);
  memcpy(ctx->tl, xd->left_txfm_context,
         sizeof(*xd->left_txfm_context) * mi_height);
  ctx->p_ta = xd->above_txfm_context;
  ctx->p_tl = xd->left_txfm_context;
}